

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void jx9VmRandomString(jx9_vm *pVm,char *zBuf,int nLen)

{
  int local_20;
  int i;
  int nLen_local;
  char *zBuf_local;
  jx9_vm *pVm_local;
  
  SyRandomness(&pVm->sPrng,zBuf,nLen);
  for (local_20 = 0; local_20 < nLen; local_20 = local_20 + 1) {
    zBuf[local_20] = "abcdefghijklmnopqrstuvwxyz"[(ulong)(long)zBuf[local_20] % 0x1a];
  }
  return;
}

Assistant:

JX9_PRIVATE void jx9VmRandomString(jx9_vm *pVm, char *zBuf, int nLen)
{
	static const char zBase[] = {"abcdefghijklmnopqrstuvwxyz"}; /* English Alphabet */
	int i;
	/* Generate a binary string first */
	SyRandomness(&pVm->sPrng, zBuf, (sxu32)nLen);
	/* Turn the binary string into english based alphabet */
	for( i = 0 ; i < nLen ; ++i ){
		 zBuf[i] = zBase[zBuf[i] % (sizeof(zBase)-1)];
	 }
}